

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O3

void replay_wait_for_steal_if_parent_was_stolen_internal(__cilkrts_worker *w)

{
  replay_entry_t *prVar1;
  replay_entry_t *prVar2;
  bool bVar3;
  replay_entry_t *prVar4;
  
  bVar3 = replay_entry_t::match(w->l->replay_list_entry,ped_type_orphaned,(w->pedigree).parent,-1);
  if (bVar3) {
    while (w->head <= w->tail + -1) {
      __cilkrts_sleep();
    }
    prVar4 = w->l->replay_list_entry;
    prVar1 = prVar4;
    if (prVar4->m_type != ped_type_last) {
      do {
        prVar4 = prVar1 + 1;
        if (prVar1[1].m_type != ped_type_orphaned) break;
        prVar2 = prVar1 + 1;
        prVar1 = prVar4;
      } while (prVar2->m_value == -1);
    }
    w->l->replay_list_entry = prVar4;
  }
  return;
}

Assistant:

void replay_wait_for_steal_if_parent_was_stolen_internal(__cilkrts_worker *w)
{
    // If our parent wasn't recorded orphanen, return now
    if (! w->l->replay_list_entry->match (ped_type_orphaned,
                                              w->pedigree.parent))
        return;

    // Stall until our parent is stolen.  Note that we're comparing head
    // and tail, not head and exc.  The steal is not completed until tail
    // is modified.
    while (!((w->tail - 1) < w->head))
        __cilkrts_sleep();

    // Consume the entry
    w->l->replay_list_entry = w->l->replay_list_entry->next_entry();
}